

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_json_schema_list_predicate(char *predicate,lys_node_list *list,int *parsed)

{
  byte bVar1;
  char *__s1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ushort **ppuVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  char *local_78;
  char *mod_name;
  char *pcStack_68;
  int mod_name_len;
  char *name;
  int *local_58;
  char *local_50;
  lys_node_list *local_48;
  int local_40;
  int local_3c;
  int nam_len;
  int has_predicate;
  
  local_58 = parsed;
  uVar2 = parse_schema_json_predicate
                    (predicate,&local_78,(int *)((long)&mod_name + 4),&stack0xffffffffffffff98,
                     &local_40,(char **)0x0,(int *)0x0,&local_3c);
  if (0 < (int)uVar2) {
    __n = (size_t)local_40;
    iVar3 = strncmp(pcStack_68,".",__n);
    if (iVar3 != 0) {
      *local_58 = *local_58 + uVar2;
      ppuVar5 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar5 + (long)*pcStack_68 * 2 + 1) & 8) == 0) {
        bVar1 = list->keys_size;
        nam_len = uVar2;
        if (bVar1 == 0) {
          uVar6 = 0;
          list = list;
          predicate = predicate;
          uVar4 = (uint)bVar1;
        }
        else {
          name = (char *)list->keys;
          has_predicate = (int)bVar1;
          uVar7 = (ulong)(uint)has_predicate;
          uVar6 = 0;
          local_50 = predicate;
          local_48 = list;
          do {
            __s1 = (char *)**(undefined8 **)(name + uVar6 * 8);
            iVar3 = strncmp(__s1,pcStack_68,__n);
            list = local_48;
            predicate = local_50;
            uVar4 = has_predicate;
            if ((iVar3 == 0) && (__s1[__n] == '\0')) goto LAB_00114445;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
          uVar6 = (ulong)(uint)has_predicate;
        }
LAB_00114445:
        uVar2 = nam_len;
        if ((uint)uVar6 == uVar4) {
          ly_vlog(list->module->ctx,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,pcStack_68);
          return -1;
        }
      }
      if (local_3c == 0) {
        return 0;
      }
      iVar3 = resolve_json_schema_list_predicate(predicate + uVar2,list,local_58);
      return iVar3;
    }
  }
  ly_vlog(list->module->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
          (ulong)(uint)(int)predicate[-(long)(int)uVar2],predicate + -(long)(int)uVar2);
  return -1;
}

Assistant:

static int
resolve_json_schema_list_predicate(const char *predicate, const struct lys_node_list *list, int *parsed)
{
    const char *mod_name, *name;
    int mod_name_len, nam_len, has_predicate, i;
    struct lys_node *key;

    if (((i = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, NULL, NULL, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(list->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-i], &predicate[-i]);
        return -1;
    }

    predicate += i;
    *parsed += i;

    if (!isdigit(name[0])) {
        for (i = 0; i < list->keys_size; ++i) {
            key = (struct lys_node *)list->keys[i];
            if (!strncmp(key->name, name, nam_len) && !key->name[nam_len]) {
                break;
            }
        }

        if (i == list->keys_size) {
            LOGVAL(list->module->ctx, LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }
    }

    /* more predicates? */
    if (has_predicate) {
        return resolve_json_schema_list_predicate(predicate, list, parsed);
    }

    return 0;
}